

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<-16>,_boost::random::detail::M3<-15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<-2>,_boost::random::detail::M3<-18>,_boost::random::detail::M2<-28>,_boost::random::detail::M5<-5,_3661901092U>,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
             *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = (uint)this->index_;
  uVar3 = (ulong)(uVar1 - 1 & 0xf);
  uVar2 = this->state_[uVar3];
  uVar6 = this->state_[uVar1 & 0xf] << 0x10 ^ this->state_[uVar1 & 0xf] ^
          this->state_[uVar1 + 0xd & 0xf] << 0xf ^ this->state_[uVar1 + 0xd & 0xf];
  uVar4 = this->state_[uVar1 + 9 & 0xf] >> 0xb ^ this->state_[uVar1 + 9 & 0xf];
  uVar5 = uVar6 ^ uVar4;
  this->state_[uVar1 & 0xf] = uVar5;
  uVar4 = uVar4 << 0x1c ^ uVar2 * 4 ^ uVar6 << 0x12 ^ uVar2 ^ (uVar5 & 0x6d22169) << 5 ^ uVar4;
  this->state_[uVar3] = uVar4;
  this->index_ = uVar3;
  return uVar4;
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }